

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
Sections::Push(Sections *this,RPCArg *arg,size_t current_indent,OuterType outer_type)

{
  Type TVar1;
  long lVar2;
  pointer pRVar3;
  const_reference __rhs;
  char *pcVar4;
  Section *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  RPCArg *arg_inner;
  pointer pRVar5;
  size_type __n;
  long in_FS_OFFSET;
  allocator<char> local_199;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Section local_138;
  string right_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string left;
  string indent_next;
  string indent;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&indent,current_indent,' ');
  __n = current_indent + 2;
  indent_next._M_dataplus._M_p = (pointer)&indent_next.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&indent_next,__n,' ');
  TVar1 = arg->m_type;
  if (RANGE < TVar1) goto LAB_00303159;
  if ((0x3bcU >> (TVar1 & 0x1f) & 1) == 0) {
    if ((0x41U >> (TVar1 & 0x1f) & 1) == 0) {
      std::__cxx11::string::string((string *)&left,&indent);
      if (outer_type == OBJ) {
        RPCArg::GetName_abi_cxx11_(&local_d8,arg);
        std::operator+(&local_b8,"\"",&local_d8);
        std::operator+(&local_138.m_left,&local_b8,"\": ");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"",(allocator<char> *)&local_b8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&left,&local_138.m_left);
      std::__cxx11::string::~string((string *)&local_138);
      if (outer_type == OBJ) {
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&left,"[");
      if (outer_type == NONE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&right_1,"",(allocator<char> *)&local_138);
      }
      else {
        RPCArg::ToDescriptionString_abi_cxx11_(&right_1,arg,outer_type == OBJ);
      }
      Section::Section(&local_138,&left,&right_1);
      PushSection(this,&local_138);
      Section::~Section(&local_138);
      pRVar3 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pRVar5 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start; pRVar5 != pRVar3; pRVar5 = pRVar5 + 1) {
        Push(this,pRVar5,__n,ARR);
      }
      std::operator+(&local_158,&indent_next,"...");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"",(allocator<char> *)&local_198);
      Section::Section(&local_138,&local_158,&local_178);
      PushSection(this,&local_138);
      Section::~Section(&local_138);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
      std::operator+(&local_178,&indent,"]");
      pcVar4 = ",";
      if (outer_type == NONE) {
        pcVar4 = "";
      }
      std::operator+(&local_158,&local_178,pcVar4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
      Section::Section(&local_138,&local_158,&local_198);
      PushSection(this,&local_138);
      Section::~Section(&local_138);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      this_01 = &right_1;
    }
    else {
      if (outer_type == NONE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&left,"",(allocator<char> *)&local_138);
LAB_00302c6a:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&right_1,"",(allocator<char> *)&local_158);
      }
      else {
        RPCArg::ToDescriptionString_abi_cxx11_(&left,arg,outer_type == OBJ);
        if (outer_type != OBJ) goto LAB_00302c6a;
        RPCArg::GetName_abi_cxx11_(&local_178,arg);
        std::operator+(&local_158,"\"",&local_178);
        std::operator+(&right_1,&local_158,"\": ");
      }
      std::operator+(&local_d8,&indent,&right_1);
      std::operator+(&local_b8,&local_d8,"{");
      Section::Section(&local_138,&local_b8,&left);
      PushSection(this,&local_138);
      Section::~Section(&local_138);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&right_1);
      if (outer_type == OBJ) {
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
      }
      pRVar3 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pRVar5 = (arg->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start; pRVar5 != pRVar3; pRVar5 = pRVar5 + 1) {
        Push(this,pRVar5,__n,OBJ);
      }
      if (arg->m_type != OBJ) {
        std::operator+(&local_b8,&indent_next,"...");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"",(allocator<char> *)&right_1);
        Section::Section(&local_138,&local_b8,&local_d8);
        PushSection(this,&local_138);
        Section::~Section(&local_138);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      std::operator+(&local_d8,&indent,"}");
      pcVar4 = ",";
      if (outer_type == NONE) {
        pcVar4 = "";
      }
      std::operator+(&local_b8,&local_d8,pcVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&right_1,"",(allocator<char> *)&local_198);
      Section::Section(&local_138,&local_b8,&right_1);
      PushSection(this,&local_138);
      Section::~Section(&local_138);
      std::__cxx11::string::~string((string *)&right_1);
      std::__cxx11::string::~string((string *)&local_b8);
      this_01 = &local_d8;
    }
  }
  else {
    if (outer_type == NONE) goto LAB_00303159;
    std::__cxx11::string::string((string *)&left,&indent);
    if ((outer_type == OBJ) &&
       ((arg->m_opts).type_str.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (arg->m_opts).type_str.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      RPCArg::GetName_abi_cxx11_(&right_1,arg);
      std::operator+(&local_d8,"\"",&right_1);
      std::operator+(&local_b8,&local_d8,"\": ");
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(&(arg->m_opts).type_str,0);
      std::operator+(&local_138.m_left,&local_b8,__rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&left,&local_138.m_left);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      this_00 = (Section *)&right_1;
    }
    else {
      if (outer_type == OBJ) {
        RPCArg::ToStringObj_abi_cxx11_(&local_138.m_left,arg,false);
      }
      else {
        RPCArg::ToString_abi_cxx11_(&local_138.m_left,arg,false);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&left,&local_138.m_left);
      this_00 = &local_138;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&left,",");
    RPCArg::ToDescriptionString_abi_cxx11_(&local_b8,arg,outer_type == OBJ);
    Section::Section(&local_138,&left,&local_b8);
    PushSection(this,&local_138);
    Section::~Section(&local_138);
    this_01 = &local_b8;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&left);
LAB_00303159:
  std::__cxx11::string::~string((string *)&indent_next);
  std::__cxx11::string::~string((string *)&indent);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Push(const RPCArg& arg, const size_t current_indent = 5, const OuterType outer_type = OuterType::NONE)
    {
        const auto indent = std::string(current_indent, ' ');
        const auto indent_next = std::string(current_indent + 2, ' ');
        const bool push_name{outer_type == OuterType::OBJ}; // Dictionary keys must have a name
        const bool is_top_level_arg{outer_type == OuterType::NONE}; // True on the first recursion

        switch (arg.m_type) {
        case RPCArg::Type::STR_HEX:
        case RPCArg::Type::STR:
        case RPCArg::Type::NUM:
        case RPCArg::Type::AMOUNT:
        case RPCArg::Type::RANGE:
        case RPCArg::Type::BOOL:
        case RPCArg::Type::OBJ_NAMED_PARAMS: {
            if (is_top_level_arg) return; // Nothing more to do for non-recursive types on first recursion
            auto left = indent;
            if (arg.m_opts.type_str.size() != 0 && push_name) {
                left += "\"" + arg.GetName() + "\": " + arg.m_opts.type_str.at(0);
            } else {
                left += push_name ? arg.ToStringObj(/*oneline=*/false) : arg.ToString(/*oneline=*/false);
            }
            left += ",";
            PushSection({left, arg.ToDescriptionString(/*is_named_arg=*/push_name)});
            break;
        }
        case RPCArg::Type::OBJ:
        case RPCArg::Type::OBJ_USER_KEYS: {
            const auto right = is_top_level_arg ? "" : arg.ToDescriptionString(/*is_named_arg=*/push_name);
            PushSection({indent + (push_name ? "\"" + arg.GetName() + "\": " : "") + "{", right});
            for (const auto& arg_inner : arg.m_inner) {
                Push(arg_inner, current_indent + 2, OuterType::OBJ);
            }
            if (arg.m_type != RPCArg::Type::OBJ) {
                PushSection({indent_next + "...", ""});
            }
            PushSection({indent + "}" + (is_top_level_arg ? "" : ","), ""});
            break;
        }
        case RPCArg::Type::ARR: {
            auto left = indent;
            left += push_name ? "\"" + arg.GetName() + "\": " : "";
            left += "[";
            const auto right = is_top_level_arg ? "" : arg.ToDescriptionString(/*is_named_arg=*/push_name);
            PushSection({left, right});
            for (const auto& arg_inner : arg.m_inner) {
                Push(arg_inner, current_indent + 2, OuterType::ARR);
            }
            PushSection({indent_next + "...", ""});
            PushSection({indent + "]" + (is_top_level_arg ? "" : ","), ""});
            break;
        }
        } // no default case, so the compiler can warn about missing cases
    }